

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

qint64 QBenchmarkValgrindUtils::extractResult(QString *fileName)

{
  storage_type *psVar1;
  qsizetype qVar2;
  char cVar3;
  undefined8 extraout_RAX;
  undefined1 *puVar4;
  bool bVar5;
  bool bVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  __integer_from_chars_result_type<long_long> _Var10;
  qint64 v;
  undefined1 *local_88 [4];
  QArrayData *local_68;
  storage_type *psStack_60;
  qsizetype local_58;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48,fileName);
  QFile::open((QFile *)&local_48,0x11);
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)0x0;
  psStack_60 = (storage_type *)0x0;
  local_58 = 0;
  bVar5 = false;
  bVar6 = false;
  do {
    cVar3 = QIODevice::readLineInto(&local_48,(longlong)&local_68);
    qVar2 = local_58;
    if (cVar3 == '\0') break;
    QVar8.m_data = psStack_60;
    QVar8.m_size = local_58;
    QVar9.m_data = "summary: ";
    QVar9.m_size = 9;
    cVar3 = QtPrivate::startsWith(QVar8,QVar9);
    bVar7 = true;
    if (cVar3 != '\0') {
      if ((local_68 == (QArrayData *)0x0) ||
         (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_68,(AllocationOption)qVar2);
      }
      psVar1 = psStack_60;
      if ((local_68 == (QArrayData *)0x0) ||
         (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_68,(AllocationOption)local_58);
      }
      local_88[0] = &DAT_aaaaaaaaaaaaaaaa;
      _Var10 = std::from_chars<long_long>(psVar1 + 9,psStack_60 + local_58,(longlong *)local_88,10);
      bVar7 = _Var10.ec != 0;
      bVar6 = bVar5;
      if (!bVar7) {
        bVar6 = true;
        puVar4 = local_88[0];
        bVar5 = bVar6;
      }
    }
  } while (bVar7);
  if (bVar6) {
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,1,0x10);
      }
    }
    QFile::~QFile((QFile *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
      return (qint64)puVar4;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    extractResult((QBenchmarkValgrindUtils *)local_88);
    QFile::~QFile((QFile *)&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
      _Unwind_Resume(extraout_RAX);
    }
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractResult(const QString &fileName)
{
    QFile file(fileName);
    const bool openOk = file.open(QIODevice::ReadOnly | QIODevice::Text);
    Q_ASSERT(openOk);
    Q_UNUSED(openOk);

    std::optional<qint64> val = std::nullopt;
    QByteArray line;
    while (file.readLineInto(&line)) {
        constexpr QByteArrayView tag = "summary: ";
        if (line.startsWith(tag)) {
            const auto maybeNumber = line.data() + tag.size();
            const auto end = line.data() + line.size();
            qint64 v;
            const auto r = std::from_chars(maybeNumber, end, v);
            if (r.ec == std::errc{}) {
                val = v;
                break;
            }
        }
    }
    if (Q_UNLIKELY(!val))
        qFatal("Failed to extract result");
    return *val;
}